

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_oid.hpp
# Opt level: O2

void jsoncons::bson::detail::init_hex_char_pairs(oid_t *oid,uint16_t *data)

{
  *data = *(uint16_t *)
           (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
           (ulong)(oid->bytes_)._M_elems[0] * 2);
  data[1] = *(uint16_t *)
             (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
             (ulong)(oid->bytes_)._M_elems[1] * 2);
  data[2] = *(uint16_t *)
             (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
             (ulong)(oid->bytes_)._M_elems[2] * 2);
  data[3] = *(uint16_t *)
             (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
             (ulong)(oid->bytes_)._M_elems[3] * 2);
  data[4] = *(uint16_t *)
             (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
             (ulong)(oid->bytes_)._M_elems[4] * 2);
  data[5] = *(uint16_t *)
             (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
             (ulong)(oid->bytes_)._M_elems[5] * 2);
  data[6] = *(uint16_t *)
             (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
             (ulong)(oid->bytes_)._M_elems[6] * 2);
  data[7] = *(uint16_t *)
             (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
             (ulong)(oid->bytes_)._M_elems[7] * 2);
  data[8] = *(uint16_t *)
             (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
             (ulong)(oid->bytes_)._M_elems[8] * 2);
  data[9] = *(uint16_t *)
             (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
             (ulong)(oid->bytes_)._M_elems[9] * 2);
  data[10] = *(uint16_t *)
              (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
              (ulong)(oid->bytes_)._M_elems[10] * 2);
  data[0xb] = *(uint16_t *)
               (get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
               (ulong)(oid->bytes_)._M_elems[0xb] * 2);
  return;
}

Assistant:

inline
        void init_hex_char_pairs(const oid_t& oid, uint16_t* data)
        {
            const uint8_t* bytes = oid.data();
            const uint16_t* gHexCharPairs = get_hex_char_pairs(std::integral_constant<bool, jsoncons::endian::native == jsoncons::endian::big>());

            data[0] = gHexCharPairs[bytes[0]];
            data[1] = gHexCharPairs[bytes[1]];
            data[2] = gHexCharPairs[bytes[2]];
            data[3] = gHexCharPairs[bytes[3]];
            data[4] = gHexCharPairs[bytes[4]];
            data[5] = gHexCharPairs[bytes[5]];
            data[6] = gHexCharPairs[bytes[6]];
            data[7] = gHexCharPairs[bytes[7]];
            data[8] = gHexCharPairs[bytes[8]];
            data[9] = gHexCharPairs[bytes[9]];
            data[10] = gHexCharPairs[bytes[10]];
            data[11] = gHexCharPairs[bytes[11]];
        }